

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O1

crnd_unpack_context crnd::crnd_unpack_begin(void *pData,uint32 data_size)

{
  undefined8 *puVar1;
  int iVar2;
  crn_unpacker *pcVar3;
  long lVar4;
  crn_unpacker *this;
  
  if (0x3d < data_size && pData != (void *)0x0) {
    pcVar3 = (crn_unpacker *)crnd_malloc(0x188,(size_t *)0x0);
    this = (crn_unpacker *)0x0;
    if (pcVar3 != (crn_unpacker *)0x0) {
      pcVar3->m_magic = 0x1ef9cabd;
      pcVar3->m_pData = (uint8 *)0x0;
      pcVar3->m_data_size = 0;
      (pcVar3->m_reference_encoding_dm).m_total_syms = 0;
      (pcVar3->m_reference_encoding_dm).m_code_sizes.m_p = (uchar *)0x0;
      (pcVar3->m_reference_encoding_dm).m_code_sizes.m_size = 0;
      (pcVar3->m_reference_encoding_dm).m_code_sizes.m_capacity = 0;
      (pcVar3->m_reference_encoding_dm).m_code_sizes.m_alloc_failed = false;
      (pcVar3->m_reference_encoding_dm).m_pDecode_tables = (decoder_tables *)0x0;
      pcVar3->m_pHeader = (crn_header *)0x0;
      (pcVar3->m_codec).m_pDecode_buf = (uint8 *)0x0;
      (pcVar3->m_codec).m_pDecode_buf_next = (uint8 *)0x0;
      (pcVar3->m_codec).m_pDecode_buf_end = (uint8 *)0x0;
      *(undefined8 *)((long)&(pcVar3->m_codec).m_pDecode_buf_end + 4) = 0;
      (pcVar3->m_codec).m_bit_buf = 0;
      (pcVar3->m_codec).m_bit_count = 0;
      lVar4 = 0x70;
      do {
        *(undefined4 *)((long)pcVar3->m_endpoint_delta_dm + lVar4 + -0x70) = 0;
        puVar1 = (undefined8 *)((long)pcVar3->m_endpoint_delta_dm + lVar4 + -0x68);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined1 *)((long)pcVar3->m_endpoint_delta_dm + lVar4 + -0x58) = 0;
        *(undefined8 *)
         ((long)&((symbol_codec *)(pcVar3->m_endpoint_delta_dm + -2))->m_pDecode_buf + lVar4) = 0;
        lVar4 = lVar4 + 0x28;
      } while (lVar4 != 0xc0);
      lVar4 = 0xc0;
      do {
        *(undefined4 *)((long)pcVar3->m_endpoint_delta_dm + lVar4 + -0x70) = 0;
        puVar1 = (undefined8 *)((long)pcVar3->m_endpoint_delta_dm + lVar4 + -0x68);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined1 *)((long)pcVar3->m_endpoint_delta_dm + lVar4 + -0x58) = 0;
        *(undefined8 *)
         ((long)&((symbol_codec *)(pcVar3->m_endpoint_delta_dm + -2))->m_pDecode_buf + lVar4) = 0;
        lVar4 = lVar4 + 0x28;
      } while (lVar4 != 0x110);
      (pcVar3->m_color_endpoints).m_p = (uint *)0x0;
      (pcVar3->m_color_endpoints).m_size = 0;
      (pcVar3->m_color_endpoints).m_capacity = 0;
      (pcVar3->m_color_endpoints).m_alloc_failed = false;
      (pcVar3->m_color_selectors).m_p = (uint *)0x0;
      (pcVar3->m_color_selectors).m_size = 0;
      (pcVar3->m_color_selectors).m_capacity = 0;
      (pcVar3->m_color_selectors).m_alloc_failed = false;
      (pcVar3->m_alpha_endpoints).m_p = (unsigned_short *)0x0;
      (pcVar3->m_alpha_endpoints).m_size = 0;
      (pcVar3->m_alpha_endpoints).m_capacity = 0;
      (pcVar3->m_alpha_endpoints).m_alloc_failed = false;
      (pcVar3->m_alpha_selectors).m_p = (unsigned_short *)0x0;
      (pcVar3->m_alpha_selectors).m_size = 0;
      (pcVar3->m_alpha_selectors).m_capacity = 0;
      (pcVar3->m_alpha_selectors).m_alloc_failed = false;
      (pcVar3->m_block_buffer).m_p = (block_buffer_element *)0x0;
      (pcVar3->m_block_buffer).m_size = 0;
      (pcVar3->m_block_buffer).m_capacity = 0;
      (pcVar3->m_block_buffer).m_alloc_failed = false;
      this = pcVar3;
    }
    if (this != (crn_unpacker *)0x0) {
      iVar2 = crn_unpacker::init(this,(EVP_PKEY_CTX *)pData);
      if ((char)iVar2 != '\0') {
        return this;
      }
      crn_unpacker::~crn_unpacker(this);
      crnd_free(this);
    }
  }
  return (crnd_unpack_context)0x0;
}

Assistant:

crnd_unpack_context crnd_unpack_begin(const void* pData, uint32 data_size)
    {
        if ((!pData) || (data_size < cCRNHeaderMinSize))
            return NULL;

        crn_unpacker* p = crnd_new<crn_unpacker>();
        if (!p)
            return NULL;

        if (!p->init(pData, data_size))
        {
            crnd_delete(p);
            return NULL;
        }

        return p;
    }